

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O1

void * lzham::lzham_default_realloc
                 (void *p,size_t size,size_t *pActual_size,bool movable,void *pUser_data)

{
  void *pvVar1;
  size_t sVar2;
  
  if (p == (void *)0x0) {
    pvVar1 = malloc(size);
    if (pActual_size == (size_t *)0x0) {
      return pvVar1;
    }
    p = pvVar1;
    if (pvVar1 == (void *)0x0) {
      sVar2 = 0;
      goto LAB_0011b108;
    }
  }
  else {
    if (size == 0) {
      free(p);
      sVar2 = 0;
      pvVar1 = (void *)0x0;
      if (pActual_size == (size_t *)0x0) {
        return (void *)0x0;
      }
      goto LAB_0011b108;
    }
    if (movable) {
      pvVar1 = realloc(p,size);
      if (pvVar1 != (void *)0x0) {
        p = pvVar1;
      }
    }
    else {
      pvVar1 = (void *)0x0;
    }
    if (pActual_size == (size_t *)0x0) {
      return pvVar1;
    }
  }
  sVar2 = malloc_usable_size(p);
LAB_0011b108:
  *pActual_size = sVar2;
  return pvVar1;
}

Assistant:

static void* lzham_default_realloc(void* p, size_t size, size_t* pActual_size, bool movable, void* pUser_data)
   {
      pUser_data;

      void* p_new;

      if (!p)
      {
         p_new = malloc(size);
         LZHAM_ASSERT( (reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0 );

         if (pActual_size)
            *pActual_size = p_new ? _msize(p_new) : 0;
      }
      else if (!size)
      {
         free(p);
         p_new = NULL;

         if (pActual_size)
            *pActual_size = 0;
      }
      else
      {
         void* p_final_block = p;
#ifdef WIN32
         p_new = _expand(p, size);
#else

         p_new = NULL;
#endif

         if (p_new)
         {
            LZHAM_ASSERT( (reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0 );
            p_final_block = p_new;
         }
         else if (movable)
         {
            p_new = realloc(p, size);

            if (p_new)
            {
               LZHAM_ASSERT( (reinterpret_cast<ptr_bits_t>(p_new) & (LZHAM_MIN_ALLOC_ALIGNMENT - 1)) == 0 );
               p_final_block = p_new;
            }
         }

         if (pActual_size)
            *pActual_size = _msize(p_final_block);
      }

      return p_new;
   }